

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTest::iterate(TestStatus *__return_storage_ptr__,DrawTest *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkOffset3D offset;
  VkSemaphore *pVVar3;
  bool bVar4;
  uint uVar5;
  VkResult VVar6;
  Buffer *pBVar7;
  VkCommandBuffer_s **ppVVar8;
  Handle<(vk::HandleType)18> *pHVar9;
  VkBuffer VVar10;
  Image *this_00;
  VkQueue queue_00;
  Allocator *allocator;
  TestContext *this_01;
  TestLog *log;
  Move<vk::VkCommandBuffer_s_*> *this_02;
  allocator<char> local_239;
  string local_238;
  undefined4 local_218;
  allocator<char> local_211;
  string local_210;
  ConstPixelBufferAccess local_1f0;
  void *local_1c8;
  undefined4 local_1c0;
  undefined1 local_1b8 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  PixelBufferAccess local_178;
  TextureFormat local_150;
  undefined1 local_148 [8];
  TextureLevel referenceFrame;
  undefined8 uStack_118;
  VkSubmitInfo submitInfo;
  VkQueue queue;
  deUint32 firstInstance;
  undefined1 local_a8 [4];
  deUint32 numIndirectDraws;
  VkDrawIndirectCommand commands_1 [3];
  VkDrawIndexedIndirectCommand commands [3];
  deUint32 numInstances;
  deUint64 local_28;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  DrawTest *this_local;
  
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  vertexBuffer.m_internal = 0;
  pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                     (&(this->super_DrawTestsBaseClass).m_vertexBuffer);
  local_28 = (deUint64)Draw::Buffer::object(pBVar7);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,*ppVVar8,0,1,&local_28,&vertexBuffer);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DrawTestsBaseClass).m_pipeline.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar9->m_internal);
  bVar4 = isIndexed(this);
  if (bVar4) {
    pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
    ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar8;
    pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indexBuffer);
    VVar10 = Draw::Buffer::object(pBVar7);
    (*pDVar1->_vptr_DeviceInterface[0x57])(pDVar1,pVVar2,VVar10.m_internal,0,1);
  }
  bVar4 = isInstanced(this);
  uVar5 = 1;
  if (bVar4) {
    uVar5 = 3;
  }
  bVar4 = isIndirect(this);
  if (bVar4) {
    bVar4 = isIndexed(this);
    if (bVar4) {
      commands_1[2].firstVertex = 4;
      commands_1[2].firstInstance = uVar5;
      isFirstInstance(this);
      isFirstInstance(this);
      isFirstInstance(this);
      Draw::(anonymous_namespace)::DrawTest::
      setIndirectCommand<vk::VkDrawIndexedIndirectCommand,3ul>
                ((DrawTest *)this,(VkDrawIndexedIndirectCommand (*) [3])&commands_1[2].firstVertex);
    }
    else {
      local_a8 = (undefined1  [4])0x4;
      commands_1[0].vertexCount = 2;
      numIndirectDraws = uVar5;
      bVar4 = isFirstInstance(this);
      commands_1[0].instanceCount = 0;
      if (bVar4) {
        commands_1[0].instanceCount = 2;
      }
      commands_1[0].firstVertex = 4;
      commands_1[1].vertexCount = 9;
      commands_1[0].firstInstance = uVar5;
      bVar4 = isFirstInstance(this);
      commands_1[1].instanceCount = (deUint32)bVar4;
      commands_1[1].firstVertex = 4;
      commands_1[2].vertexCount = 2;
      commands_1[1].firstInstance = uVar5;
      bVar4 = isFirstInstance(this);
      commands_1[2].instanceCount = 0;
      if (bVar4) {
        commands_1[2].instanceCount = 3;
      }
      Draw::(anonymous_namespace)::DrawTest::setIndirectCommand<vk::VkDrawIndirectCommand,3ul>
                ((DrawTest *)this,(VkDrawIndirectCommand (*) [3])local_a8);
    }
  }
  bVar4 = isIndirect(this);
  if (bVar4) {
    bVar4 = isMultiDraw(this);
    uVar5 = 1;
    if (bVar4) {
      uVar5 = 3;
    }
    bVar4 = isIndexed(this);
    if (bVar4) {
      pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
      ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>);
      pVVar2 = *ppVVar8;
      pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indirectBuffer);
      VVar10 = Draw::Buffer::object(pBVar7);
      (*pDVar1->_vptr_DeviceInterface[0x5c])(pDVar1,pVVar2,VVar10.m_internal,0,(ulong)uVar5,0x14);
    }
    else {
      pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
      ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>);
      pVVar2 = *ppVVar8;
      pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indirectBuffer);
      VVar10 = Draw::Buffer::object(pBVar7);
      (*pDVar1->_vptr_DeviceInterface[0x5b])(pDVar1,pVVar2,VVar10.m_internal,0,(ulong)uVar5,0x10);
    }
  }
  else {
    bVar4 = isIndexed(this);
    if (bVar4) {
      pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
      ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>);
      (*pDVar1->_vptr_DeviceInterface[0x5a])(pDVar1,*ppVVar8,4,(ulong)uVar5,0xb,1,2);
    }
    else {
      pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
      ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>);
      (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,*ppVVar8,4,(ulong)uVar5,2);
    }
  }
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  this_02 = &(this->super_DrawTestsBaseClass).m_cmdBuffer;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar8);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar8);
  submitInfo.pSignalSemaphores =
       (VkSemaphore *)
       Context::getUniversalQueue((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_118 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = submitInfo.pSignalSemaphores;
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_data.m_cap,0);
  VVar6 = (*pDVar1->_vptr_DeviceInterface[2])
                    (pDVar1,pVVar3,1,&uStack_118,referenceFrame.m_data.m_cap);
  ::vk::checkResult(VVar6,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawShaderDrawParametersTests.cpp"
                    ,0x13b);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  VVar6 = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,submitInfo.pSignalSemaphores);
  ::vk::checkResult(VVar6,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawShaderDrawParametersTests.cpp"
                    ,0x13c);
  local_150 = ::vk::mapVkFormat((this->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_148,&local_150,0x100,0x100,1);
  tcu::TextureLevel::getAccess(&local_178,(TextureLevel *)local_148);
  drawReferenceImage(this,&local_178);
  renderedFrame.m_data = (void *)0x0;
  this_00 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestsBaseClass).m_colorTargetImage);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_1c0 = 0;
  local_1c8 = renderedFrame.m_data;
  offset.z = 0;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_1b8,this_00,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  this_01 = Context::getTestContext((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_01);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_1f0,(TextureLevel *)local_148);
  bVar4 = tcu::fuzzyCompare(log,"Result","Image comparison result",&local_1f0,
                            (ConstPixelBufferAccess *)local_1b8,0.05,COMPARE_LOG_RESULT);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"OK",&local_239);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"Rendered image is incorrect",&local_211);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
  }
  local_218 = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_148);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTest::iterate (void)
{
	// Draw
	{
		beginRenderPass();

		const vk::VkDeviceSize	vertexBufferOffset	= 0;
		const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

		m_vk.cmdBindVertexBuffers	(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
		m_vk.cmdBindPipeline		(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		if (isIndexed())
			m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), 0ull, vk::VK_INDEX_TYPE_UINT32);

		const deUint32			numInstances		= isInstanced() ? MAX_INSTANCE_COUNT : 1;

		if (isIndirect())
		{
			if (isIndexed())
			{
				const vk::VkDrawIndexedIndirectCommand commands[] =
				{
					// indexCount, instanceCount, firstIndex, vertexOffset, firstInstance
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_INDEX,	OFFSET_FIRST_INDEX,		(isFirstInstance() ? 2u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_SECOND_INDEX,	OFFSET_SECOND_INDEX,	(isFirstInstance() ? 1u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_INDEX,	OFFSET_FIRST_INDEX,		(isFirstInstance() ? 3u : 0u) },
				};
				setIndirectCommand(commands);
			}
			else
			{
				const vk::VkDrawIndirectCommand commands[] =
				{
					// vertexCount, instanceCount, firstVertex, firstInstance
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_VERTEX,	(isFirstInstance() ? 2u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_SECOND_VERTEX,	(isFirstInstance() ? 1u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_VERTEX,	(isFirstInstance() ? 3u : 0u) },
				};
				setIndirectCommand(commands);
			}
		}

		if (isIndirect())
		{
			const deUint32 numIndirectDraws = isMultiDraw() ? MAX_INDIRECT_DRAW_COUNT : 1;

			if (isIndexed())
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), 0ull, numIndirectDraws, sizeof(vk::VkDrawIndexedIndirectCommand));
			else
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), 0ull, numIndirectDraws, sizeof(vk::VkDrawIndirectCommand));
		}
		else
		{
			const deUint32 firstInstance = 2;

			if (isIndexed())
				m_vk.cmdDrawIndexed(*m_cmdBuffer, NUM_VERTICES, numInstances, NDX_FIRST_INDEX, OFFSET_FIRST_INDEX, firstInstance);
			else
				m_vk.cmdDraw(*m_cmdBuffer, NUM_VERTICES, numInstances, NDX_FIRST_VERTEX, firstInstance);
		}

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);
	}

	// Submit
	{
		const vk::VkQueue		queue		= m_context.getUniversalQueue();
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0,											// deUint32					waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,											// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
			0,											// deUint32					signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*		pSignalSemaphores;
		};
		VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}

	// Validate
	{
		tcu::TextureLevel referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), static_cast<int>(0.5f + WIDTH), static_cast<int>(0.5f + HEIGHT));

		drawReferenceImage(referenceFrame.getAccess());

		const vk::VkOffset3D				zeroOffset		= { 0, 0, 0 };
		const tcu::ConstPixelBufferAccess	renderedFrame	= m_colorTargetImage->readSurface(m_context.getUniversalQueue(), m_context.getDefaultAllocator(),
															  vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

		if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", referenceFrame.getAccess(), renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is incorrect");
		else
			return tcu::TestStatus::pass("OK");
	}
}